

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

void __thiscall ImgfsFile::filename_enumerator(ImgfsFile *this,namefn *fn)

{
  _Rb_tree_node_base *p_Var1;
  _Self __tmp;
  
  p_Var1 = (this->_files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var1 == &(this->_files)._M_t._M_impl.super__Rb_tree_header) {
      return;
    }
    if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) break;
    (*fn->_M_invoker)((_Any_data *)fn,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (p_Var1 + 1));
    p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
  }
  std::__throw_bad_function_call();
}

Assistant:

virtual void filename_enumerator(namefn fn)
    {
        for (auto i=_files.begin() ; i!=_files.end() ; i++)
        {
            fn((*i).first);
        }
    }